

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

bool __thiscall FPolyObj::MovePolyobj(FPolyObj *this,DVector2 *pos,bool force)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FBoundingBox bounds;
  bool bVar4;
  undefined3 in_register_00000011;
  FPolyObj *this_00;
  bool bVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  DVector2 local_38;
  
  dVar11 = (this->Bounds).m_Box[0];
  dVar12 = (this->Bounds).m_Box[1];
  dVar1 = (this->Bounds).m_Box[2];
  dVar2 = (this->Bounds).m_Box[3];
  UnLinkPolyobj(this);
  DoMovePolyobj(this,pos);
  if ((CONCAT31(in_register_00000011,force) == 0) && ((this->Sidedefs).Count != 0)) {
    uVar6 = 0;
    bVar5 = false;
    do {
      bVar4 = CheckMobjBlocking(this,(this->Sidedefs).Array[uVar6]);
      if (bVar4) {
        bVar5 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->Sidedefs).Count);
    if (bVar5) {
      local_38.X._0_4_ = *(undefined4 *)&pos->X;
      local_38.Y._0_4_ = *(undefined4 *)&pos->Y;
      local_38.X._4_4_ = *(uint *)((long)&pos->X + 4) ^ 0x80000000;
      local_38.Y._4_4_ = *(uint *)((long)&pos->Y + 4) ^ 0x80000000;
      DoMovePolyobj(this,&local_38);
      LinkPolyobj(this);
      return false;
    }
  }
  (this->StartSpot).pos.X = pos->X + (this->StartSpot).pos.X;
  (this->StartSpot).pos.Y = pos->Y + (this->StartSpot).pos.Y;
  (this->CenterSpot).pos.X = pos->X + (this->CenterSpot).pos.X;
  (this->CenterSpot).pos.Y = pos->Y + (this->CenterSpot).pos.Y;
  LinkPolyobj(this);
  this_00 = this;
  ClearSubsectorLinks(this);
  dVar3 = (this->Bounds).m_Box[2];
  uVar7 = SUB84(dVar3,0);
  uVar8 = (undefined4)((ulong)dVar3 >> 0x20);
  if (dVar1 <= dVar3) {
    uVar7 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  dVar1 = (this->Bounds).m_Box[0];
  uVar9 = SUB84(dVar1,0);
  uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
  if (dVar1 <= dVar11) {
    uVar9 = SUB84(dVar11,0);
    uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
  }
  dVar11 = (this->Bounds).m_Box[1];
  if (dVar12 <= dVar11) {
    dVar11 = dVar12;
  }
  dVar12 = (this->Bounds).m_Box[3];
  if (dVar12 <= dVar2) {
    dVar12 = dVar2;
  }
  bounds.m_Box[0]._4_4_ = uVar10;
  bounds.m_Box[0]._0_4_ = uVar9;
  bounds.m_Box[2]._4_4_ = uVar8;
  bounds.m_Box[2]._0_4_ = uVar7;
  bounds.m_Box[1] = dVar11;
  bounds.m_Box[3] = dVar12;
  RecalcActorFloorCeil(this_00,bounds);
  return true;
}

Assistant:

bool FPolyObj::MovePolyobj (const DVector2 &pos, bool force)
{
	FBoundingBox oldbounds = Bounds;
	UnLinkPolyobj ();
	DoMovePolyobj (pos);

	if (!force)
	{
		bool blocked = false;

		for(unsigned i=0;i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			DoMovePolyobj (-pos);
			LinkPolyobj();
			return false;
		}
	}
	StartSpot.pos += pos;
	CenterSpot.pos += pos;
	LinkPolyobj ();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}